

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O3

string * __thiscall
CoreML::enumeratedShapesToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *enumerated,bool useArrayFormat)

{
  ulong uVar1;
  string *psVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  string separator;
  stringstream ss;
  char local_204;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar3 = (ulong)useArrayFormat;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar5 = " | ";
  if ((int)enumerated != 0) {
    pcVar5 = ", ";
  }
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,pcVar5,pcVar5 + ((ulong)enumerated & 0xffffffff ^ 3));
  local_1c0 = __return_storage_ptr__;
  if ((char)((ulong)enumerated & 0xffffffff) != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
  }
  lVar6 = *(long *)this;
  if (*(long *)(this + 8) != lVar6) {
    lVar4 = 0;
    uVar7 = 0;
    do {
      dimensionsToString_abi_cxx11_
                (&local_1e0,(CoreML *)(lVar6 + lVar4),
                 (vector<long,_std::allocator<long>_> *)((ulong)enumerated & 0xff),SUB81(uVar3,0));
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      lVar6 = *(long *)this;
      uVar1 = (*(long *)(this + 8) - lVar6 >> 3) * -0x5555555555555555;
      uVar3 = uVar1 - 1;
      if (uVar7 < uVar3) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8);
        lVar6 = *(long *)this;
        uVar1 = (*(long *)(this + 8) - lVar6 >> 3) * -0x5555555555555555;
      }
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar7 < uVar1);
  }
  local_204 = (char)enumerated;
  if (local_204 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  }
  std::__cxx11::stringbuf::str();
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string enumeratedShapesToString(const std::vector<std::vector<int64_t>> &enumerated, bool useArrayFormat = false) {
        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " | ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i=0; i<enumerated.size(); i++) {
            ss << dimensionsToString(enumerated[i],useArrayFormat);
            if (i < enumerated.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }